

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapeLinear>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pair<int,_long> *ppVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  MElementType MVar10;
  long lVar11;
  int *piVar12;
  ostream *poVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  int maxorder [3];
  int scalarorder;
  long local_3e8;
  TPZGenMatrix<int> shapeorders;
  TPZManVector<int,_3> VectorSides;
  TPZManVector<int,_3> directions;
  TPZManVector<int,_3> bilinear;
  TPZManVector<int,_3> normalsides;
  TPZManVector<int,_10> facevector;
  TPZManVector<long,_27> FirstIndex;
  TPZManVector<int,_81> vecpermute;
  
  TPZManVector<int,_3>::TPZManVector(&VectorSides,3);
  TPZManVector<int,_3>::TPZManVector(&bilinear,3);
  TPZManVector<int,_3>::TPZManVector(&directions,3);
  TPZManVector<int,_3>::TPZManVector(&normalsides,3);
  pztopology::TPZLine::GetSideHDivDirections
            (&VectorSides.super_TPZVec<int>,&directions.super_TPZVec<int>,
             &bilinear.super_TPZVec<int>,&normalsides.super_TPZVec<int>);
  if ((data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x6c);
  }
  iVar2 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[2];
  iVar8 = pzshape::TPZShapeLinear::NShapeF(&(data->fH1ConnectOrders).super_TPZVec<int>);
  vecpermute.super_TPZVec<int>._vptr_TPZVec._0_4_ = 2;
  TPZManVector<int,_10>::TPZManVector
            (&facevector,VectorSides.super_TPZVec<int>.fNElements,(int *)&vecpermute);
  TPZManVector<int,_81>::TPZManVector(&vecpermute,3);
  uVar18 = 0;
  for (iVar20 = 0; lVar11 = (long)(int)uVar18, lVar17 = lVar11, iVar20 != 3; iVar20 = iVar20 + 1) {
    iVar9 = pztopology::TPZLine::SideDimension(iVar20);
    if (iVar9 == 0) {
      TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&shapeorders);
      pztopology::TPZLine::LowerDimensionSides(iVar20,(TPZStack<int,_10> *)&shapeorders);
      uVar19 = (int)shapeorders.fCols + 1;
      TPZManVector<int,_27>::TPZManVector((TPZManVector<int,_27> *)&FirstIndex,(long)(int)uVar19);
      HDivPermutation(iVar20,data,(TPZVec<int> *)&FirstIndex);
      uVar15 = (ulong)uVar19;
      if ((int)uVar19 < 1) {
        uVar15 = 0;
      }
      for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
        vecpermute.super_TPZVec<int>.fStore[lVar11 + uVar16] =
             *(int *)((long)FirstIndex.super_TPZVec<long>.fStore + uVar16 * 4) + uVar18;
        facevector.super_TPZVec<int>.fStore[lVar11 + uVar16] = iVar20;
      }
      uVar18 = uVar18 + (int)uVar16;
      TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)&FirstIndex);
      TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)&shapeorders);
    }
  }
  for (; lVar17 < vecpermute.super_TPZVec<int>.fNElements; lVar17 = lVar17 + 1) {
    vecpermute.super_TPZVec<int>.fStore[lVar17] = (int)lVar17;
  }
  TPZGenMatrix<int>::TPZGenMatrix(&shapeorders,(long)iVar8,3);
  pzshape::TPZShapeLinear::ShapeOrder
            (&(data->fCornerNodeIds).super_TPZVec<long>,&(data->fH1ConnectOrders).super_TPZVec<int>,
             &shapeorders);
  scalarorder = (data->fHDivConnectOrders).super_TPZVec<int>.fStore[2] + 1;
  TPZManVector<long,_27>::TPZManVector(&FirstIndex,4);
  FirstShapeIndex(&FirstIndex.super_TPZVec<long>,&scalarorder);
  local_3e8 = VectorSides.super_TPZVec<int>.fNElements;
  if ((int)uVar18 < 1) {
    uVar18 = 0;
  }
  iVar8 = 0;
  for (uVar15 = 0; uVar15 != uVar18; uVar15 = uVar15 + 1) {
    iVar20 = vecpermute.super_TPZVec<int>.fStore[uVar15];
    iVar9 = VectorSides.super_TPZVec<int>.fStore[iVar20];
    iVar3 = (data->fHDivConnectOrders).super_TPZVec<int>.fStore
            [facevector.super_TPZVec<int>.fStore[uVar15]];
    lVar17 = FirstIndex.super_TPZVec<long>.fStore[(long)iVar9 + 1];
    for (lVar21 = (long)(int)FirstIndex.super_TPZVec<long>.fStore[iVar9]; lVar21 < (int)lVar17;
        lVar21 = lVar21 + 1) {
      uVar19 = pztopology::TPZLine::SideDimension(iVar9);
      if ((int)uVar19 < 1) {
        uVar19 = 0;
      }
      bVar7 = true;
      for (uVar16 = 0; uVar19 != uVar16; uVar16 = uVar16 + 1) {
        piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,uVar16);
        if (iVar3 < *piVar12) {
          bVar7 = false;
        }
      }
      if (bVar7) {
        ppVar5 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
        ppVar5[iVar8].first = iVar20;
        ppVar5[iVar8].second = lVar21;
        iVar8 = iVar8 + 1;
      }
    }
  }
  do {
    if (local_3e8 <= lVar11) {
      iVar2 = (int)(data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fNElements;
      if (iVar8 == iVar2) {
        TPZManVector<long,_27>::~TPZManVector(&FirstIndex);
        TPZGenMatrix<int>::~TPZGenMatrix(&shapeorders);
        TPZManVector<int,_81>::~TPZManVector(&vecpermute);
        TPZManVector<int,_10>::~TPZManVector(&facevector);
        TPZManVector<int,_3>::~TPZManVector(&normalsides);
        TPZManVector<int,_3>::~TPZManVector(&directions);
        TPZManVector<int,_3>::~TPZManVector(&bilinear);
        TPZManVector<int,_3>::~TPZManVector(&VectorSides);
        return;
      }
      poVar13 = std::operator<<((ostream *)&std::cout,"count ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar8);
      poVar13 = std::operator<<(poVar13,"\nivs ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,iVar2);
      std::endl<char,std::char_traits<char>>(poVar13);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                 ,0x113);
    }
    iVar20 = vecpermute.super_TPZVec<int>.fStore[lVar11];
    iVar9 = VectorSides.super_TPZVec<int>.fStore[iVar20];
    iVar3 = bilinear.super_TPZVec<int>.fStore[iVar20];
    iVar4 = directions.super_TPZVec<int>.fStore[iVar20];
    MVar10 = pztopology::TPZLine::Type(iVar9);
    lVar17 = FirstIndex.super_TPZVec<long>.fStore[(long)iVar9 + 1];
    for (lVar21 = (long)(int)FirstIndex.super_TPZVec<long>.fStore[iVar9]; lVar21 < (int)lVar17;
        lVar21 = lVar21 + 1) {
      uVar18 = pztopology::TPZLine::SideDimension(iVar9);
      maxorder[0] = iVar2;
      maxorder[1] = iVar2;
      maxorder[2] = iVar2;
      if (iVar3 != 0) {
        maxorder[iVar4] = maxorder[iVar4] + 1;
      }
      if ((int)uVar18 < 1) {
        uVar18 = 0;
      }
      bVar7 = true;
      for (uVar15 = 0; uVar18 != uVar15; uVar15 = uVar15 + 1) {
        switch(MVar10) {
        case EOned:
          piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,0);
          break;
        case ETriangle:
        case ETetraedro:
          piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,uVar15);
          iVar14 = maxorder[uVar15] + 1;
          iVar1 = *piVar12;
          bVar23 = SBORROW4(iVar1,iVar14);
          iVar6 = iVar1 - iVar14;
          bVar22 = iVar1 == iVar14;
          goto LAB_00f6ebad;
        case EQuadrilateral:
          piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,uVar15);
          break;
        case EPiramide:
          piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,uVar15);
          break;
        case EPrisma:
          piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,uVar15);
          break;
        case ECube:
          piVar12 = TPZGenMatrix<int>::operator()(&shapeorders,lVar21,uVar15);
          break;
        default:
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
                     ,0x104);
        }
        iVar14 = *piVar12;
        iVar1 = maxorder[uVar15];
        bVar23 = SBORROW4(iVar14,iVar1);
        iVar6 = iVar14 - iVar1;
        bVar22 = iVar14 == iVar1;
LAB_00f6ebad:
        if (!bVar22 && bVar23 == iVar6 < 0) {
          bVar7 = false;
        }
      }
      if (bVar7) {
        ppVar5 = (data->fSDVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
        ppVar5[iVar8].first = iVar20;
        ppVar5[iVar8].second = lVar21;
        iVar8 = iVar8 + 1;
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}